

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<void_*>::erase
          (SmallVectorImpl<void_*> *this,const_iterator CS,const_iterator CE)

{
  iterator ppvVar1;
  void **ppvVar2;
  iterator I;
  iterator N;
  iterator E;
  iterator S;
  const_iterator CE_local;
  const_iterator CS_local;
  SmallVectorImpl<void_*> *this_local;
  
  ppvVar1 = SmallVectorTemplateCommon<void_*,_void>::begin
                      ((SmallVectorTemplateCommon<void_*,_void> *)this);
  if (CS < ppvVar1) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x1c6,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  if (CE < CS) {
    __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x1c7,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  ppvVar1 = SmallVectorTemplateCommon<void_*,_void>::end
                      ((SmallVectorTemplateCommon<void_*,_void> *)this);
  if (ppvVar1 < CE) {
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x1c8,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  ppvVar1 = SmallVectorTemplateCommon<void_*,_void>::end
                      ((SmallVectorTemplateCommon<void_*,_void> *)this);
  ppvVar2 = std::move<void**,void**>(CE,ppvVar1,CS);
  ppvVar1 = SmallVectorTemplateCommon<void_*,_void>::end
                      ((SmallVectorTemplateCommon<void_*,_void> *)this);
  SmallVectorTemplateBase<void_*,_true>::destroy_range(ppvVar2,ppvVar1);
  ppvVar1 = SmallVectorTemplateCommon<void_*,_void>::begin
                      ((SmallVectorTemplateCommon<void_*,_void> *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,(long)ppvVar2 - (long)ppvVar1 >> 3);
  return CS;
}

Assistant:

iterator erase(const_iterator CS, const_iterator CE) {
    // Just cast away constness because this is a non-const member function.
    iterator S = const_cast<iterator>(CS);
    iterator E = const_cast<iterator>(CE);

    assert(S >= this->begin() && "Range to erase is out of bounds.");
    assert(S <= E && "Trying to erase invalid range.");
    assert(E <= this->end() && "Trying to erase past the end.");

    iterator N = S;
    // Shift all elts down.
    iterator I = std::move(E, this->end(), S);
    // Drop the last elts.
    this->destroy_range(I, this->end());
    this->set_size(I - this->begin());
    return(N);
  }